

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QMovableArrayOps<QByteArray>::emplace<QByteArray_const&>
          (QMovableArrayOps<QByteArray> *this,qsizetype i,QByteArray *args)

{
  QByteArray *pQVar1;
  Data *pDVar2;
  Data *pDVar3;
  char *pcVar4;
  qsizetype qVar5;
  long lVar6;
  QByteArray *pQVar7;
  bool bVar8;
  
  pDVar2 = (this->super_QGenericArrayOps<QByteArray>).super_QArrayDataPointer<QByteArray>.d;
  if ((pDVar2 == (Data *)0x0) ||
     (1 < (__int_type)(pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>)) {
LAB_00111415:
    pDVar3 = (args->d).d;
    pcVar4 = (args->d).ptr;
    qVar5 = (args->d).size;
    if (pDVar3 != (Data *)0x0) {
      LOCK();
      (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    bVar8 = (this->super_QGenericArrayOps<QByteArray>).super_QArrayDataPointer<QByteArray>.size != 0
    ;
    QArrayDataPointer<QByteArray>::detachAndGrow
              ((QArrayDataPointer<QByteArray> *)this,(uint)(i == 0 && bVar8),1,(QByteArray **)0x0,
               (QArrayDataPointer<QByteArray> *)0x0);
    pQVar7 = (this->super_QGenericArrayOps<QByteArray>).super_QArrayDataPointer<QByteArray>.ptr;
    if (i == 0 && bVar8) {
      pQVar7[-1].d.d = pDVar3;
      pQVar7[-1].d.ptr = pcVar4;
      pQVar7[-1].d.size = qVar5;
      (this->super_QGenericArrayOps<QByteArray>).super_QArrayDataPointer<QByteArray>.ptr =
           pQVar7 + -1;
      i = (this->super_QGenericArrayOps<QByteArray>).super_QArrayDataPointer<QByteArray>.size;
      goto LAB_001114bb;
    }
    pQVar1 = pQVar7 + i;
    memmove(pQVar1 + 1,pQVar7 + i,
            ((this->super_QGenericArrayOps<QByteArray>).super_QArrayDataPointer<QByteArray>.size - i
            ) * 0x18);
    (pQVar1->d).d = pDVar3;
    (pQVar1->d).ptr = pcVar4;
    (pQVar1->d).size = qVar5;
  }
  else {
    lVar6 = (this->super_QGenericArrayOps<QByteArray>).super_QArrayDataPointer<QByteArray>.size;
    if ((lVar6 != i) ||
       (pQVar7 = (this->super_QGenericArrayOps<QByteArray>).super_QArrayDataPointer<QByteArray>.ptr,
       (pDVar2->super_QArrayData).alloc - i ==
       ((long)((long)pQVar7 -
              ((ulong)((long)&pDVar2[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 3) *
       -0x5555555555555555)) {
      if ((i == 0) &&
         (pQVar7 = (this->super_QGenericArrayOps<QByteArray>).super_QArrayDataPointer<QByteArray>.
                   ptr,
         (QByteArray *)((ulong)((long)&pDVar2[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)
         != pQVar7)) {
        pDVar3 = (args->d).d;
        pQVar7[-1].d.d = pDVar3;
        pQVar7[-1].d.ptr = (args->d).ptr;
        pQVar7[-1].d.size = (args->d).size;
        if (pDVar3 != (Data *)0x0) {
          LOCK();
          (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
          pQVar7 = (this->super_QGenericArrayOps<QByteArray>).super_QArrayDataPointer<QByteArray>.
                   ptr;
          lVar6 = (this->super_QGenericArrayOps<QByteArray>).super_QArrayDataPointer<QByteArray>.
                  size;
        }
        (this->super_QGenericArrayOps<QByteArray>).super_QArrayDataPointer<QByteArray>.ptr =
             pQVar7 + -1;
        i = lVar6;
        goto LAB_001114bb;
      }
      goto LAB_00111415;
    }
    pDVar3 = (args->d).d;
    pQVar7[i].d.d = pDVar3;
    pQVar7[i].d.ptr = (args->d).ptr;
    pQVar7[i].d.size = (args->d).size;
    if (pDVar3 == (Data *)0x0) goto LAB_001114bb;
    LOCK();
    (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  i = (this->super_QGenericArrayOps<QByteArray>).super_QArrayDataPointer<QByteArray>.size;
LAB_001114bb:
  (this->super_QGenericArrayOps<QByteArray>).super_QArrayDataPointer<QByteArray>.size = i + 1;
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }